

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O2

void __thiscall
GCSFilter::GCSFilter
          (GCSFilter *this,Params *params,
          vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_filter,
          bool skip_decode_check)

{
  long lVar1;
  uint64_t uVar2;
  pointer puVar3;
  undefined3 uVar4;
  uint32_t uVar5;
  ulong uVar6;
  char *pcVar7;
  char in_CL;
  undefined7 in_register_00000011;
  undefined8 *puVar8;
  uint64_t i;
  ulong uVar9;
  long in_FS_OFFSET;
  BitStreamReader<SpanReader> bitreader;
  SpanReader stream;
  
  puVar8 = (undefined8 *)CONCAT71(in_register_00000011,skip_decode_check);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = *(undefined3 *)&params->field_0x11;
  uVar5 = params->m_M;
  (this->m_params).m_P = params->m_P;
  *(undefined3 *)&(this->m_params).field_0x11 = uVar4;
  (this->m_params).m_M = uVar5;
  uVar2 = params->m_siphash_k1;
  (this->m_params).m_siphash_k0 = params->m_siphash_k0;
  (this->m_params).m_siphash_k1 = uVar2;
  puVar3 = (pointer)puVar8[1];
  (this->m_encoded).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)*puVar8;
  (this->m_encoded).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar3;
  (this->m_encoded).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)puVar8[2];
  puVar8[2] = 0;
  *puVar8 = 0;
  puVar8[1] = 0;
  stream.m_data.m_data =
       (this->m_encoded).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  stream.m_data.m_size =
       (long)(this->m_encoded).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)stream.m_data.m_data;
  uVar6 = ReadCompactSize<SpanReader>(&stream,true);
  this->m_N = (uint32_t)uVar6;
  if (uVar6 >> 0x20 == 0) {
    this->m_F = uVar6 * (this->m_params).m_M;
    if (in_CL == '\0') {
      bitreader._8_4_ = bitreader._8_4_ & 0xffffff00;
      bitreader.m_offset = 8;
      bitreader.m_istream = &stream;
      for (uVar9 = 0; uVar9 < (uVar6 & 0xffffffff); uVar9 = uVar9 + 1) {
        GolombRiceDecode<SpanReader>(&bitreader,(this->m_params).m_P);
        uVar6 = (ulong)this->m_N;
      }
      if (stream.m_data.m_size != 0) {
        pcVar7 = (char *)__cxa_allocate_exception(0x20);
        std::iostream_category();
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar7,(error_code *)"encoded_filter contains excess data");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(pcVar7,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_003b5fa8;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    pcVar7 = (char *)__cxa_allocate_exception(0x20);
    bitreader._8_8_ = std::iostream_category();
    bitreader.m_istream = (SpanReader *)CONCAT44(bitreader.m_istream._4_4_,1);
    std::ios_base::failure[abi:cxx11]::failure(pcVar7,(error_code *)"N must be <2^32");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar7,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_003b5fa8:
  __stack_chk_fail();
}

Assistant:

GCSFilter::GCSFilter(const Params& params, std::vector<unsigned char> encoded_filter, bool skip_decode_check)
    : m_params(params), m_encoded(std::move(encoded_filter))
{
    SpanReader stream{m_encoded};

    uint64_t N = ReadCompactSize(stream);
    m_N = static_cast<uint32_t>(N);
    if (m_N != N) {
        throw std::ios_base::failure("N must be <2^32");
    }
    m_F = static_cast<uint64_t>(m_N) * static_cast<uint64_t>(m_params.m_M);

    if (skip_decode_check) return;

    // Verify that the encoded filter contains exactly N elements. If it has too much or too little
    // data, a std::ios_base::failure exception will be raised.
    BitStreamReader bitreader{stream};
    for (uint64_t i = 0; i < m_N; ++i) {
        GolombRiceDecode(bitreader, m_params.m_P);
    }
    if (!stream.empty()) {
        throw std::ios_base::failure("encoded_filter contains excess data");
    }
}